

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.h
# Opt level: O3

void __thiscall MinVR::VRParseCommandLine::noParsing(VRParseCommandLine *this)

{
  std::__cxx11::string::_M_replace
            ((ulong)&this->_setConfigValueShort,0,
             (char *)(this->_setConfigValueShort)._M_string_length,0x15eb4f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->_setConfigValueLong,0,
             (char *)(this->_setConfigValueLong)._M_string_length,0x15eb4f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->_loadConfigShort,0,(char *)(this->_loadConfigShort)._M_string_length,
             0x15eb4f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->_loadConfigLong,0,(char *)(this->_loadConfigLong)._M_string_length,
             0x15eb4f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->_helpShort,0,(char *)(this->_helpShort)._M_string_length,0x15eb4f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->_helpLong,0,(char *)(this->_helpLong)._M_string_length,0x15eb4f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->_noExecute,0,(char *)(this->_noExecute)._M_string_length,0x15eb4f);
  return;
}

Assistant:

void noParsing() {
    _setConfigValueShort = "";
    _setConfigValueLong = "";
    _loadConfigShort = "";
    _loadConfigLong = "";
    _helpShort = "";
    _helpLong = "";
    _noExecute = "";
  }